

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O2

bool __thiscall ADSBBase::ProcessFetchedData(ADSBBase *this)

{
  int iVar1;
  JSON_Object *pJVar2;
  JSON_Array *array;
  size_t sVar3;
  char *__s;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  FDKeyType _eType;
  ulong index;
  bool bVar4;
  double dVar5;
  double tBufPeriod;
  string hexKey;
  JSONRootPtr pRoot;
  FDKeyTy fdKey;
  string acFilter;
  positionTy viewPos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (((this->super_LTFlightDataChannel).super_LTOnlineChannel.httpResponse | 2U) == 0x193) {
    if ((int)dataRefs.iLogLevel < 4) {
      sVar3 = (this->super_LTFlightDataChannel).super_LTOnlineChannel.netDataPos;
      if (sVar3 == 0) {
        viewPos._lat = 1.08471766698494e-317;
      }
      else {
        FetchMsg_abi_cxx11_((string *)&viewPos,
                            (ADSBBase *)
                            (this->super_LTFlightDataChannel).super_LTOnlineChannel.netData,in_RDX);
      }
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
             ,0x3a,"ProcessFetchedData",logERR,"ADS-B Exchange: API Key test FAILED: %s",
             viewPos._lat);
      in_RDX = extraout_RDX;
      if (sVar3 != 0) {
        std::__cxx11::string::~string((string *)&viewPos);
        in_RDX = extraout_RDX_00;
      }
    }
    sVar3 = (this->super_LTFlightDataChannel).super_LTOnlineChannel.netDataPos;
    if (sVar3 == 0) {
      fdKey._0_8_ = "";
    }
    else {
      FetchMsg_abi_cxx11_((string *)&fdKey,
                          (ADSBBase *)
                          (this->super_LTFlightDataChannel).super_LTOnlineChannel.netData,in_RDX);
    }
    CreateMsgWindow(12.0,logERR,"ADS-B Exchange: API Key test FAILED: %s",fdKey._0_8_);
    if (sVar3 != 0) {
      std::__cxx11::string::~string((string *)&fdKey);
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[7])
              (this,0,1);
    return false;
  }
  if ((this->super_LTFlightDataChannel).super_LTOnlineChannel.netDataPos == 0) {
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
    return false;
  }
  pRoot.super_unique_ptr<json_value_t,_void_(*)(json_value_t_*)>._M_t.
  super___uniq_ptr_impl<json_value_t,_void_(*)(json_value_t_*)>._M_t.
  super__Tuple_impl<0UL,_json_value_t_*,_void_(*)(json_value_t_*)>.
  super__Head_base<0UL,_json_value_t_*,_false>._M_head_impl = json_parse_string((char *)0x13b2ce);
  pRoot.super_unique_ptr<json_value_t,_void_(*)(json_value_t_*)>._M_t.
  super___uniq_ptr_impl<json_value_t,_void_(*)(json_value_t_*)>._M_t.
  super__Tuple_impl<0UL,_json_value_t_*,_void_(*)(json_value_t_*)>.
  super__Tuple_impl<1UL,_void_(*)(json_value_t_*)>.
  super__Head_base<1UL,_void_(*)(json_value_t_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(json_value_t_*),_false>)json_value_free;
  if (pRoot.super_unique_ptr<json_value_t,_void_(*)(json_value_t_*)>._M_t.
      super___uniq_ptr_impl<json_value_t,_void_(*)(json_value_t_*)>._M_t.
      super__Tuple_impl<0UL,_json_value_t_*,_void_(*)(json_value_t_*)>.
      super__Head_base<0UL,_json_value_t_*,_false>._M_head_impl == (JSON_Value *)0x0) {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
             ,0x48,"ProcessFetchedData",logERR,"Parsing flight data as JSON failed");
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
  }
  else {
    pJVar2 = json_object(pRoot.super_unique_ptr<json_value_t,_void_(*)(json_value_t_*)>._M_t.
                         super___uniq_ptr_impl<json_value_t,_void_(*)(json_value_t_*)>._M_t.
                         super__Tuple_impl<0UL,_json_value_t_*,_void_(*)(json_value_t_*)>.
                         super__Head_base<0UL,_json_value_t_*,_false>._M_head_impl);
    if (pJVar2 == (JSON_Object *)0x0) {
      if ((int)dataRefs.iLogLevel < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
               ,0x4c,"ProcessFetchedData",logERR,"JSON: Getting main object failed");
      }
      (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
                (this);
    }
    else {
      iVar1 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                _vptr_LTChannel[0x16])(this,pJVar2);
      if ((char)iVar1 != '\0') {
        DataRefs::GetViewPos();
        dVar5 = jog_n_nan(pJVar2,"now");
        if (NAN(dVar5)) {
          dVar5 = json_object_dotget_number(pJVar2,"ctime");
        }
        dVar5 = (double)(~-(ulong)(70000000000.0 < dVar5) & (ulong)dVar5 |
                        (ulong)(dVar5 / 1000.0) & -(ulong)(70000000000.0 < dVar5));
        if (1546344000.0 < dVar5) {
          DataRefs::ChTsOffsetAdd(&dataRefs,dVar5);
        }
        tBufPeriod = (double)dataRefs.fdBufPeriod;
        DataRefs::GetDebugAcFilter_abi_cxx11_(&acFilter,&dataRefs);
        array = json_object_get_array(pJVar2,"ac");
        if ((array == (JSON_Array *)0x0) &&
           (array = json_object_get_array(pJVar2,"aircraft"), array == (JSON_Array *)0x0)) {
          bVar4 = true;
        }
        else {
          index = 0;
          while( true ) {
            sVar3 = json_array_get_count(array);
            bVar4 = sVar3 <= index;
            if (bVar4) break;
            pJVar2 = json_array_get_object(array,index);
            if (pJVar2 == (JSON_Object *)0x0) {
              if ((int)dataRefs.iLogLevel < 4) {
                LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
                       ,0x72,"ProcessFetchedData",logERR,
                       "JSON: Could not get %lu. aircraft in \'%s\'",index + 1,"ac");
              }
              iVar1 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                        _vptr_LTChannel[8])(this);
              if ((char)iVar1 == '\0') break;
            }
            else {
              __s = jog_s(pJVar2,"hex");
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&hexKey,__s,(allocator<char> *)&fdKey);
              if (hexKey._M_string_length == 0) {
                jog_s(pJVar2,"icao");
                std::__cxx11::string::assign((char *)&hexKey);
                if (hexKey._M_string_length != 0) {
                  if ((int)dataRefs.iLogLevel < 3) {
                    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
                           ,0x81,"ProcessFetchedData",logWARN,
                           "%s: Received data looks like ADSBEx v1, which is no longer supported!",
                           (this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                           pszChName);
                  }
                  (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                    _vptr_LTChannel[8])(this);
                  std::__cxx11::string::~string((string *)&hexKey);
                  bVar4 = false;
                  break;
                }
              }
              else {
                _eType = KEY_ICAO;
                if (*hexKey._M_dataplus._M_p == '~') {
                  std::__cxx11::string::erase((ulong)&hexKey,0);
                  _eType = KEY_ADSBEX;
                }
                std::__cxx11::string::string((string *)&local_50,(string *)&hexKey);
                LTFlightData::FDKeyTy::FDKeyTy(&fdKey,_eType,&local_50,0x10);
                std::__cxx11::string::~string((string *)&local_50);
                if (acFilter._M_string_length == 0) {
LAB_0013b4d2:
                  ProcessV2(this,pJVar2,&fdKey,tBufPeriod,dVar5,&viewPos);
                }
                else {
                  std::__cxx11::string::string((string *)&local_70,(string *)&acFilter);
                  bVar4 = std::operator!=(&fdKey.key,&local_70);
                  std::__cxx11::string::~string((string *)&local_70);
                  if (!bVar4) goto LAB_0013b4d2;
                }
                std::__cxx11::string::~string((string *)&fdKey.key);
              }
              std::__cxx11::string::~string((string *)&hexKey);
            }
            index = index + 1;
          }
        }
        std::__cxx11::string::~string((string *)&acFilter);
        goto LAB_0013b761;
      }
    }
  }
  bVar4 = false;
LAB_0013b761:
  std::unique_ptr<json_value_t,_void_(*)(json_value_t_*)>::~unique_ptr
            (&pRoot.super_unique_ptr<json_value_t,_void_(*)(json_value_t_*)>);
  return bVar4;
}

Assistant:

bool ADSBBase::ProcessFetchedData ()
{
    // received an UNAUTHOIZRED response? Then the key is invalid!
    if (httpResponse == HTTP_UNAUTHORIZED || httpResponse == HTTP_FORBIDDEN) {
        SHOW_MSG(logERR, ERR_ADSBEX_KEY_FAILED,
                 netDataPos ? FetchMsg(netData).c_str() : "");
        SetValid(false);
        return false;
    }

    // data is expected to be in netData string
    // short-cut if there is nothing
    if ( !netDataPos ) {
        IncErrCnt();
        return false;
    }
    
    // now try to interpret it as JSON
    JSONRootPtr pRoot (netData);
    if (!pRoot) { LOG_MSG(logERR,ERR_JSON_PARSE); IncErrCnt(); return false; }
    
    // first get the structre's main object
    JSON_Object* pObj = json_object(pRoot.get());
    if (!pObj) { LOG_MSG(logERR,ERR_JSON_MAIN_OBJECT); IncErrCnt(); return false; }
    
    // Test for any channel-specific errors
    if (!ProcessErrors(pObj)) return false;
    
    // We need to calculate distance to current camera later on
    const positionTy viewPos = dataRefs.GetViewPos();
    
    // for determining an offset as compared to network time we need to know network time
    // Also used later to calcualte the position's timestamp
    double adsbxTime = jog_n_nan(pObj, ADSBEX_NOW);
    if (std::isnan(adsbxTime))
        adsbxTime = jog_n(pObj, ADSBEX_TIME);
    // Convert a timestamp in milliseconds to a timestamp in seconds
    if (adsbxTime > 70000000000.0)
        adsbxTime /= 1000.0;
    
    // if reasonable add this to our time offset calculation
    if (adsbxTime > JAN_FIRST_2019)
        dataRefs.ChTsOffsetAdd(adsbxTime);
    
    // Cut-off time: We ignore tracking data, which is older than our buffering time
    const double tBufPeriod = (double) dataRefs.GetFdBufPeriod();
    
    // any a/c filter defined for debugging purposes?
    const std::string acFilter ( dataRefs.GetDebugAcFilter() );
    
    // let's cycle the aircraft
    // fetch the aircraft array, adsb.fi defines a different aircraft key unfortunately
    JSON_Array* pJAcList = json_object_get_array(pObj, ADSBEX_AIRCRAFT_ARR);
    if (!pJAcList)
        pJAcList = json_object_get_array(pObj, ADSBFI_AIRCRAFT_ARR);
    // iterate all aircraft in the received flight data (can be 0 or even pJAcList == NULL!)
    for ( size_t i=0; pJAcList && (i < json_array_get_count(pJAcList)); i++ )
    {
        // get the aircraft
        JSON_Object* pJAc = json_array_get_object(pJAcList,i);
        if (!pJAc) {
            LOG_MSG(logERR,ERR_JSON_AC,i+1,ADSBEX_AIRCRAFT_ARR);
            if (IncErrCnt())
                continue;
            else
                return false;
        }
        
        // try version 2 first
        std::string hexKey = jog_s(pJAc, ADSBEX_V2_TRANSP_ICAO);
        if (hexKey.empty()) {
            // not found, try version 1
            hexKey = jog_s(pJAc, ADSBEX_V1_TRANSP_ICAO);
            if (!hexKey.empty()) {
                // Hm...this could be v1 data...since v4.2 we don't process that any longer
                LOG_MSG(logWARN, "%s: Received data looks like ADSBEx v1, which is no longer supported!",
                        ChName());
                IncErrCnt();
                return false;
            }
            // Either way, this can't be processed
            continue;
        }
        
        // the key: transponder Icao code or some other code
        LTFlightData::FDKeyType keyType = LTFlightData::KEY_ICAO;
        if (hexKey.front() == '~') {        // key is a non-icao code?
            hexKey.erase(0, 1);             // remove the ~
            keyType = LTFlightData::KEY_ADSBEX;
        }
        LTFlightData::FDKeyTy fdKey (keyType, hexKey);
        
        // not matching a/c filter? -> skip it
        if (!acFilter.empty() && (fdKey != acFilter))
            continue;

        // Process the details
        try {
            ProcessV2(pJAc, fdKey, tBufPeriod, adsbxTime, viewPos);
        } catch(const std::system_error& e) {
            LOG_MSG(logERR, ERR_LOCK_ERROR, "mapFd", e.what());
        } catch(...) {
            LOG_MSG(logERR, "Exception while processing data for '%s'", hexKey.c_str());
        }
    }
    
    // success
    return true;
}